

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditTestPackage.cpp
# Opt level: O1

int __thiscall dit::TestPackage::init(TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  BuildInfoTests::BuildInfoTests
            ((BuildInfoTests *)pTVar1,(this->super_TestPackage).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  DelibsTests::DelibsTests((DelibsTests *)pTVar1,(this->super_TestPackage).super_TestNode.m_testCtx)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  FrameworkTests::FrameworkTests
            ((FrameworkTests *)pTVar1,(this->super_TestPackage).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestPackage).super_TestNode.m_testCtx,"deqp",
             "dEQP Test Framework Self-tests");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_002725c8;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void TestPackage::init (void)
{
	addChild(new BuildInfoTests	(m_testCtx));
	addChild(new DelibsTests	(m_testCtx));
	addChild(new FrameworkTests	(m_testCtx));
	addChild(new DeqpTests		(m_testCtx));
}